

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_sort.c
# Opt level: O0

void linkedlist_sort(s_linkedlist *linked_list,f_comparator comparator)

{
  bool bVar1;
  int iVar2;
  s_linkedlist_node *psStack_28;
  int swapped;
  s_linkedlist_node *lptr;
  s_linkedlist_node *node;
  f_comparator comparator_local;
  s_linkedlist *linked_list_local;
  
  psStack_28 = (s_linkedlist_node *)0x0;
  do {
    bVar1 = false;
    for (lptr = linked_list->head; lptr->next != psStack_28; lptr = lptr->next) {
      iVar2 = (*comparator)(lptr->element,lptr->next->element);
      if (0 < iVar2) {
        linkedlistnode_swap(lptr,lptr->next);
        bVar1 = true;
      }
    }
    psStack_28 = lptr;
  } while (bVar1);
  return;
}

Assistant:

void linkedlist_sort(s_linkedlist *linked_list, f_comparator comparator) {
    s_linkedlist_node *node   = NULL;
    s_linkedlist_node *lptr   = NULL;
    int               swapped = 0;

    do {
        node    = linked_list->head;
        swapped = 0;

        while (node->next != lptr) {
            if (comparator(node->element, node->next->element) > 0) {
                linkedlistnode_swap(node, node->next);
                swapped = 1;
            }

            node = node->next;
        }

        lptr = node;
    } while (swapped);
}